

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_io.c
# Opt level: O3

int cfg_io_save(cfg_instance *instance,char *url,cfg_db *src,autobuf *log)

{
  int iVar1;
  cfg_io *pcVar2;
  char *fmt;
  char *io_param;
  char *local_20;
  
  local_20 = (char *)0x0;
  pcVar2 = _find_io(instance,url,&local_20,log);
  if (pcVar2 == (cfg_io *)0x0) {
    fmt = "Error, unknown config io \'%s\'.";
  }
  else {
    if (pcVar2->save != (_func_int_char_ptr_cfg_db_ptr_autobuf_ptr *)0x0) {
      iVar1 = (*pcVar2->save)(local_20,src,log);
      return iVar1;
    }
    url = pcVar2->name;
    fmt = "Error, config io \'%s\' does not support saving.";
  }
  cfg_append_printable_line(log,fmt,url);
  return -1;
}

Assistant:

int
cfg_io_save(struct cfg_instance *instance, const char *url, struct cfg_db *src, struct autobuf *log) {
  struct cfg_io *io;
  const char *io_param = NULL;

  io = _find_io(instance, url, &io_param, log);
  if (io == NULL) {
    cfg_append_printable_line(log, "Error, unknown config io '%s'.", url);
    return -1;
  }

  if (io->save == NULL) {
    cfg_append_printable_line(log, "Error, config io '%s' does not support saving.", io->name);
    return -1;
  }
  return io->save(io_param, src, log);
}